

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void av1_set_sad_per_bit(AV1_COMP *cpi,int *sadperbit,int qindex)

{
  aom_bit_depth_t aVar1;
  int *piVar2;
  
  aVar1 = ((cpi->common).seq_params)->bit_depth;
  if (aVar1 == AOM_BITS_8) {
    piVar2 = sad_per_bit_lut_8;
  }
  else if (aVar1 == AOM_BITS_12) {
    piVar2 = sad_per_bit_lut_12;
  }
  else {
    if (aVar1 != AOM_BITS_10) {
      return;
    }
    piVar2 = sad_per_bit_lut_10;
  }
  *sadperbit = piVar2[qindex];
  return;
}

Assistant:

void av1_set_sad_per_bit(const AV1_COMP *cpi, int *sadperbit, int qindex) {
  switch (cpi->common.seq_params->bit_depth) {
    case AOM_BITS_8: *sadperbit = sad_per_bit_lut_8[qindex]; break;
    case AOM_BITS_10: *sadperbit = sad_per_bit_lut_10[qindex]; break;
    case AOM_BITS_12: *sadperbit = sad_per_bit_lut_12[qindex]; break;
    default:
      assert(0 && "bit_depth should be AOM_BITS_8, AOM_BITS_10 or AOM_BITS_12");
  }
}